

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# az.hpp
# Opt level: O0

AuthFields * __thiscall
arbiter::drivers::AZ::Config::authFields(AuthFields *__return_storage_ptr__,Config *this)

{
  string local_58;
  string local_38;
  Config *local_18;
  Config *this_local;
  
  local_18 = this;
  this_local = (Config *)__return_storage_ptr__;
  ::std::__cxx11::string::string((string *)&local_38,(string *)&this->m_storageAccount);
  ::std::__cxx11::string::string((string *)&local_58,(string *)&this->m_storageAccessKey);
  AuthFields::AuthFields(__return_storage_ptr__,&local_38,&local_58);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

AuthFields authFields() const { return AuthFields(m_storageAccount, m_storageAccessKey); }